

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (string *__return_storage_ptr__,Json *this,char *value,uint length)

{
  Json JVar1;
  bool bVar2;
  char *pcVar3;
  Json *pJVar4;
  ostream *poVar5;
  void *this_00;
  undefined8 uVar6;
  string local_238 [32];
  int local_218;
  char local_211;
  undefined1 local_210 [8];
  ostringstream oss;
  Json *local_98;
  char *c;
  char *end;
  size_type maxsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_1d;
  uint local_1c;
  Json *pJStack_18;
  uint length_local;
  char *value_local;
  string *result;
  
  local_1c = (uint)value;
  pJStack_18 = this;
  value_local = (char *)__return_storage_ptr__;
  if (this == (Json *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else {
    pcVar3 = strnpbrk((char *)this,"\"\\\b\f\n\r\t",(ulong)value & 0xffffffff);
    if ((pcVar3 != (char *)0x0) ||
       (bVar2 = containsControlCharacter0((char *)pJStack_18,local_1c), bVar2)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      pJVar4 = pJStack_18 + local_1c;
      for (local_98 = pJStack_18; local_98 != pJVar4; local_98 = local_98 + 1) {
        JVar1 = *local_98;
        if (JVar1 == (Json)0x8) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
        }
        else if (JVar1 == (Json)0x9) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
        }
        else if (JVar1 == (Json)0xa) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
        }
        else if (JVar1 == (Json)0xc) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
        }
        else if (JVar1 == (Json)0xd) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
        }
        else if (JVar1 == (Json)0x22) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
        }
        else if (JVar1 == (Json)0x5c) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
        }
        else {
          bVar2 = isControlCharacter((char)*local_98);
          if ((bVar2) || (*local_98 == (Json)0x0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
            poVar5 = std::operator<<((ostream *)local_210,"\\u");
            this_00 = (void *)std::ostream::operator<<(poVar5,std::hex);
            uVar6 = std::ostream::operator<<(this_00,std::uppercase);
            local_211 = (char)std::setfill<char>('0');
            poVar5 = std::operator<<(uVar6,local_211);
            local_218 = (int)std::setw(4);
            poVar5 = std::operator<<(poVar5,(_Setw)local_218);
            std::ostream::operator<<(poVar5,(int)(char)*local_98);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_238);
            std::__cxx11::string::~string(local_238);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)*local_98);
          }
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"\"",(allocator<char> *)((long)&maxsize + 7));
      std::operator+(&local_50,&local_70,(char *)pJStack_18);
      std::operator+(__return_storage_ptr__,&local_50,"\"");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&maxsize + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static JSONCPP_STRING valueToQuotedStringN(const char* value, unsigned length) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strnpbrk(value, "\"\\\b\f\n\r\t", length) == NULL &&
      !containsControlCharacter0(value, length))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      length * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if ((isControlCharacter(*c)) || (*c == 0)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}